

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

void avro::parsing::fixup<boost::shared_ptr<avro::Node>>
               (Symbol *s,
               map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
               *m,set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                  *seen)

{
  int *piVar1;
  _Base_ptr p_Var2;
  placeholder *ppVar3;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar4;
  shared_ptr<avro::Node> *psVar5;
  _Base_ptr p_Var6;
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  *pvVar7;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *psVar8;
  pair<unsigned_long,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  *ppVar9;
  undefined8 *puVar10;
  _Rb_tree_header *p_Var11;
  ProductionPtr *p;
  _Base_ptr p_Var12;
  pointer p_00;
  bool bVar13;
  Symbol local_58;
  element_type local_48;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> local_38;
  
  switch(s->kind_) {
  case sRepeater:
    ptVar4 = boost::
             any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                       (&s->extra_);
    fixup_internal<boost::shared_ptr<avro::Node>>(&(ptVar4->super_type).tail.tail.head,m,seen);
    p = &(ptVar4->super_type).tail.tail.tail.head;
    goto LAB_00191f98;
  case sAlternative:
    pvVar7 = boost::
             any_cast<std::vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>>
                       (&s->extra_);
    p_00 = (pvVar7->
           super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    if (p_00 != (pvVar7->
                super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        fixup_internal<boost::shared_ptr<avro::Node>>(p_00,m,seen);
        p_00 = p_00 + 1;
      } while (p_00 != (pvVar7->
                       super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    }
    break;
  case sPlaceholder:
    psVar5 = boost::any_cast<boost::shared_ptr<avro::Node>const&>(&s->extra_);
    local_58._0_8_ = psVar5->px;
    p_Var2 = (_Base_ptr)(psVar5->pn).pi_;
    if (p_Var2 != (_Base_ptr)0x0) {
      LOCK();
      *(uint_least32_t *)&p_Var2->_M_parent = *(uint_least32_t *)&p_Var2->_M_parent + 1;
      UNLOCK();
    }
    p_Var6 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_58.extra_.content = (placeholder *)p_Var2;
    if (p_Var6 != (_Base_ptr)0x0) {
      p_Var11 = &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var12 = &p_Var11->_M_header;
      do {
        bVar13 = p_Var6[1]._M_parent < p_Var2;
        if (!bVar13) {
          p_Var12 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[bVar13];
      } while (p_Var6 != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var12 != p_Var11) {
        p_Var6 = p_Var12[1]._M_parent;
        boost::detail::shared_count::~shared_count((shared_count *)&local_58.extra_);
        if (p_Var6 <= p_Var2) {
          local_38.px = (element_type *)p_Var12[1]._M_left;
          local_38.pn.pi_ = (sp_counted_base *)p_Var12[1]._M_right;
          if ((_Base_ptr)local_38.pn.pi_ != (_Base_ptr)0x0) {
            LOCK();
            piVar1 = (int *)((long)&((_Base_ptr)local_38.pn.pi_)->_M_parent + 4);
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          Symbol::symbolic(&local_58,&local_38);
          s->kind_ = local_58.kind_;
          ppVar3 = (s->extra_).content;
          (s->extra_).content = local_58.extra_.content;
          local_58.extra_.content = (placeholder *)0x0;
          if ((ppVar3 != (placeholder *)0x0) &&
             ((*ppVar3->_vptr_placeholder[1])(), local_58.extra_.content != (placeholder *)0x0)) {
            (*(local_58.extra_.content)->_vptr_placeholder[1])();
          }
          boost::detail::weak_count::~weak_count(&local_38.pn);
          return;
        }
        goto LAB_00191fb4;
      }
    }
    boost::detail::shared_count::~shared_count((shared_count *)&local_58.extra_);
LAB_00191fb4:
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_58._0_8_ = &local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Placeholder symbol cannot be resolved","");
    std::runtime_error::runtime_error((runtime_error *)(puVar10 + 1),(string *)&local_58);
    *puVar10 = 0x1cc910;
    puVar10[1] = 0x1cc940;
    __cxa_throw(puVar10,&Exception::typeinfo,Exception::~Exception);
  case sIndirect:
    psVar8 = boost::
             any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                       (&s->extra_);
    local_58._0_8_ = psVar8->px;
    local_58.extra_.content = (placeholder *)(psVar8->pn).pi_;
    if ((sp_counted_base *)local_58.extra_.content != (sp_counted_base *)0x0) {
      LOCK();
      ((sp_counted_base *)local_58.extra_.content)->use_count_ =
           ((sp_counted_base *)local_58.extra_.content)->use_count_ + 1;
      UNLOCK();
    }
    fixup_internal<boost::shared_ptr<avro::Node>>((ProductionPtr *)&local_58,m,seen);
    boost::detail::shared_count::~shared_count((shared_count *)&local_58.extra_);
    break;
  case sUnionAdjust:
    ppVar9 = boost::
             any_cast<std::pair<unsigned_long,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>
                       (&s->extra_);
    p = &ppVar9->second;
LAB_00191f98:
    fixup_internal<boost::shared_ptr<avro::Node>>(p,m,seen);
    return;
  }
  return;
}

Assistant:

Kind kind() const {
        return kind_;
    }